

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_maketables.c
# Opt level: O1

uint8_t * coda_pcre2_maketables_8(pcre2_general_context_8 *gcontext)

{
  ushort uVar1;
  uint8_t uVar2;
  int iVar3;
  uint8_t *puVar4;
  ushort **ppuVar5;
  byte bVar6;
  long lVar7;
  long lVar8;
  byte *pbVar9;
  long lVar10;
  byte bVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  long local_60;
  long local_48;
  
  if (gcontext == (pcre2_general_context_8 *)0x0) {
    puVar4 = (uint8_t *)malloc(0x440);
  }
  else {
    puVar4 = (uint8_t *)(*(gcontext->memctl).malloc)(0x440,(gcontext->memctl).memory_data);
  }
  if (puVar4 == (uint8_t *)0x0) {
    puVar4 = (uint8_t *)0x0;
  }
  else {
    lVar7 = 0;
    do {
      iVar3 = tolower((int)lVar7);
      puVar4[lVar7] = (uint8_t)iVar3;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x100);
    local_48 = 0x80;
    lVar13 = 0xa0;
    lVar10 = 0x20;
    lVar17 = 0xc0;
    lVar16 = 0xe0;
    lVar8 = 0x100;
    local_60 = 0x120;
    ppuVar5 = __ctype_b_loc();
    lVar14 = 0;
    lVar12 = 0x60;
    lVar7 = 0x40;
    do {
      if ((*(byte *)((long)*ppuVar5 + lVar14 * 2 + 1) & 2) == 0) {
        iVar3 = tolower((int)lVar14);
      }
      else {
        iVar3 = toupper((int)lVar14);
      }
      uVar2 = (uint8_t)iVar3;
      if (0xff < iVar3) {
        uVar2 = (uint8_t)lVar14;
      }
      puVar4[lVar14 + 0x100] = uVar2;
      lVar14 = lVar14 + 1;
      lVar7 = lVar7 + 1;
      lVar12 = lVar12 + 1;
      local_48 = local_48 + 1;
      lVar13 = lVar13 + 1;
      lVar10 = lVar10 + 1;
      lVar17 = lVar17 + 1;
      lVar16 = lVar16 + 1;
      lVar8 = lVar8 + 1;
      local_60 = local_60 + 1;
    } while (lVar14 != 0x100);
    uVar15 = 0;
    memset(puVar4 + 0x200,0,0x140);
    ppuVar5 = __ctype_b_loc();
    do {
      bVar11 = (byte)uVar15;
      if ((*(byte *)((long)*ppuVar5 + uVar15 * 2 + 1) & 8) != 0) {
        puVar4[lVar7 + (ulong)((uint)(uVar15 >> 3) & 0x1fffffbf) + 0x100] =
             puVar4[lVar7 + (ulong)((uint)(uVar15 >> 3) & 0x1fffffbf) + 0x100] |
             '\x01' << (bVar11 & 7);
      }
      if ((*(byte *)((long)*ppuVar5 + uVar15 * 2 + 1) & 1) != 0) {
        puVar4[lVar12 + (ulong)((uint)(uVar15 >> 3) & 0x1fffff9f) + 0x100] =
             puVar4[lVar12 + (ulong)((uint)(uVar15 >> 3) & 0x1fffff9f) + 0x100] |
             '\x01' << (bVar11 & 7);
      }
      if ((*(byte *)((long)*ppuVar5 + uVar15 * 2 + 1) & 2) != 0) {
        puVar4[(ulong)((uint)(uVar15 >> 3) & 0x1fffff7f) + local_48 + 0x100] =
             puVar4[(ulong)((uint)(uVar15 >> 3) & 0x1fffff7f) + local_48 + 0x100] |
             '\x01' << (bVar11 & 7);
      }
      if (((*ppuVar5)[uVar15] & 8) != 0) {
        puVar4[(ulong)((uint)(uVar15 >> 3) & 0x1fffff5f) + lVar13 + 0x100] =
             puVar4[(ulong)((uint)(uVar15 >> 3) & 0x1fffff5f) + lVar13 + 0x100] |
             '\x01' << (bVar11 & 7);
      }
      if (uVar15 == 0x5f) {
        puVar4[0x2ab] = puVar4[0x2ab] | 0x80;
      }
      if ((*(byte *)((long)*ppuVar5 + uVar15 * 2 + 1) & 0x20) != 0) {
        puVar4[(uVar15 >> 3) + 0x200] = '\x01' << (bVar11 & 7) | puVar4[(uVar15 >> 3) + 0x200];
      }
      if ((*(byte *)((long)*ppuVar5 + uVar15 * 2 + 1) & 0x10) != 0) {
        puVar4[(ulong)((uint)(uVar15 >> 3) & 0x1fffffdf) + lVar10 + 0x100] =
             puVar4[(ulong)((uint)(uVar15 >> 3) & 0x1fffffdf) + lVar10 + 0x100] |
             '\x01' << (bVar11 & 7);
      }
      if ((short)(*ppuVar5)[uVar15] < 0) {
        puVar4[(ulong)((uint)(uVar15 >> 3) & 0x1fffff3f) + lVar17 + 0x100] =
             puVar4[(ulong)((uint)(uVar15 >> 3) & 0x1fffff3f) + lVar17 + 0x100] |
             '\x01' << (bVar11 & 7);
      }
      if ((*(byte *)((long)*ppuVar5 + uVar15 * 2 + 1) & 0x40) != 0) {
        puVar4[(ulong)((uint)(uVar15 >> 3) & 0x1fffff1f) + lVar16 + 0x100] =
             puVar4[(ulong)((uint)(uVar15 >> 3) & 0x1fffff1f) + lVar16 + 0x100] |
             '\x01' << (bVar11 & 7);
      }
      if (((*ppuVar5)[uVar15] & 4) != 0) {
        puVar4[(ulong)((uint)(uVar15 >> 3) & 0x1ffffeff) + lVar8 + 0x100] =
             puVar4[(ulong)((uint)(uVar15 >> 3) & 0x1ffffeff) + lVar8 + 0x100] |
             '\x01' << (bVar11 & 7);
      }
      if (((*ppuVar5)[uVar15] & 2) != 0) {
        puVar4[(ulong)((uint)(uVar15 >> 3) & 0x1ffffedf) + local_60 + 0x100] =
             puVar4[(ulong)((uint)(uVar15 >> 3) & 0x1ffffedf) + local_60 + 0x100] |
             '\x01' << (bVar11 & 7);
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != 0x100);
    pbVar9 = puVar4 + 0x340;
    lVar7 = 0;
    ppuVar5 = __ctype_b_loc();
    do {
      uVar1 = (*ppuVar5)[lVar7];
      bVar11 = (byte)(uVar1 >> 8);
      bVar11 = bVar11 & 8 | (byte)(uVar1 >> 7) & 4 | bVar11 >> 1 & 2 | bVar11 >> 5 & 1;
      bVar6 = bVar11 + 0x10;
      if ((uVar1 & 8) != 0) {
        bVar11 = bVar6;
      }
      if (lVar7 == 0x5f) {
        bVar11 = bVar6;
      }
      *pbVar9 = bVar11;
      pbVar9 = pbVar9 + 1;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x100);
  }
  return puVar4;
}

Assistant:

PCRE2_EXP_DEFN const uint8_t * PCRE2_CALL_CONVENTION
pcre2_maketables(pcre2_general_context *gcontext)
{
uint8_t *yield = (uint8_t *)((gcontext != NULL)?
  gcontext->memctl.malloc(TABLES_LENGTH, gcontext->memctl.memory_data) :
  malloc(TABLES_LENGTH));
#endif  /* PCRE2_DFTABLES */

int i;
uint8_t *p;

if (yield == NULL) return NULL;
p = yield;

/* First comes the lower casing table */

for (i = 0; i < 256; i++) *p++ = tolower(i);

/* Next the case-flipping table */

for (i = 0; i < 256; i++)
  {
  int c = islower(i)? toupper(i) : tolower(i);
  *p++ = (c < 256)? c : i;
  }

/* Then the character class tables. Don't try to be clever and save effort on
exclusive ones - in some locales things may be different.

Note that the table for "space" includes everything "isspace" gives, including
VT in the default locale. This makes it work for the POSIX class [:space:].
From PCRE1 release 8.34 and for all PCRE2 releases it is also correct for Perl
space, because Perl added VT at release 5.18.

Note also that it is possible for a character to be alnum or alpha without
being lower or upper, such as "male and female ordinals" (\xAA and \xBA) in the
fr_FR locale (at least under Debian Linux's locales as of 12/2005). So we must
test for alnum specially. */

memset(p, 0, cbit_length);
for (i = 0; i < 256; i++)
  {
  if (isdigit(i))  p[cbit_digit  + i/8] |= 1u << (i&7);
  if (isupper(i))  p[cbit_upper  + i/8] |= 1u << (i&7);
  if (islower(i))  p[cbit_lower  + i/8] |= 1u << (i&7);
  if (isalnum(i))  p[cbit_word   + i/8] |= 1u << (i&7);
  if (i == '_')    p[cbit_word   + i/8] |= 1u << (i&7);
  if (isspace(i))  p[cbit_space  + i/8] |= 1u << (i&7);
  if (isxdigit(i)) p[cbit_xdigit + i/8] |= 1u << (i&7);
  if (isgraph(i))  p[cbit_graph  + i/8] |= 1u << (i&7);
  if (isprint(i))  p[cbit_print  + i/8] |= 1u << (i&7);
  if (ispunct(i))  p[cbit_punct  + i/8] |= 1u << (i&7);
  if (iscntrl(i))  p[cbit_cntrl  + i/8] |= 1u << (i&7);
  }
p += cbit_length;

/* Finally, the character type table. In this, we used to exclude VT from the
white space chars, because Perl didn't recognize it as such for \s and for
comments within regexes. However, Perl changed at release 5.18, so PCRE1
changed at release 8.34 and it's always been this way for PCRE2. */

for (i = 0; i < 256; i++)
  {
  int x = 0;
  if (isspace(i)) x += ctype_space;
  if (isalpha(i)) x += ctype_letter;
  if (islower(i)) x += ctype_lcletter;
  if (isdigit(i)) x += ctype_digit;
  if (isalnum(i) || i == '_') x += ctype_word;
  *p++ = x;
  }

return yield;
}